

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UDPSender.hpp
# Opt level: O2

void __thiscall Statsd::UDPSender::~UDPSender(UDPSender *this)

{
  int __fd;
  
  __fd = this->m_socket;
  if (__fd != -1) {
    if ((this->m_batchingThread)._M_id._M_thread != 0) {
      (this->m_mustExit)._M_base._M_i = true;
      std::thread::join();
      __fd = this->m_socket;
    }
    close(__fd);
  }
  std::__cxx11::string::~string((string *)&this->m_errorMessage);
  std::thread::~thread(&this->m_batchingThread);
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque(&this->m_batchingMessageQueue);
  std::__cxx11::string::~string((string *)&this->m_host);
  return;
}

Assistant:

inline UDPSender::~UDPSender() {
    if (!initialized()) {
        return;
    }

    // If we're running a background thread tell it to stop
    if (m_batchingThread.joinable()) {
        m_mustExit.store(true, std::memory_order_release);
        m_batchingThread.join();
    }

    // Cleanup the socket
    SOCKET_CLOSE(m_socket);
}